

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_3x6(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *dataptr;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_5c;
  int *local_50;
  
  memset(in_RDI,0,0x100);
  local_50 = in_RDI;
  for (local_5c = 0; local_5c < 6; local_5c = local_5c + 1) {
    pbVar7 = (byte *)(*(long *)(in_RSI + (long)local_5c * 8) + (ulong)in_EDX);
    bVar1 = *pbVar7;
    bVar2 = pbVar7[2];
    uVar6 = (uint)pbVar7[1];
    bVar3 = *pbVar7;
    bVar4 = pbVar7[2];
    *local_50 = ((uint)bVar1 + (uint)bVar2 + uVar6 + -0x180) * 8;
    local_50[2] = (int)((((long)(int)((uint)bVar1 + (uint)bVar2) - (long)(int)uVar6) -
                        (long)(int)uVar6) * 0x16a1 + 0x200 >> 10);
    local_50[1] = (int)((long)(int)((uint)bVar3 - (uint)bVar4) * 0x2731 + 0x200 >> 10);
    local_50 = local_50 + 8;
  }
  local_50 = in_RDI;
  for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
    iVar5 = *local_50;
    lVar8 = (long)(local_50[8] + local_50[0x20]);
    lVar9 = (long)(iVar5 + local_50[0x28]) + (long)(local_50[0x10] + local_50[0x18]);
    lVar10 = (long)(*local_50 - local_50[0x28]);
    lVar11 = (long)(local_50[8] - local_50[0x20]);
    lVar12 = (long)(local_50[0x10] - local_50[0x18]);
    *local_50 = (int)((lVar9 + lVar8) * 0x38e4 + 0x4000 >> 0xf);
    local_50[0x10] =
         (int)(((long)(iVar5 + local_50[0x28]) - (long)(local_50[0x10] + local_50[0x18])) * 0x45ad +
               0x4000 >> 0xf);
    local_50[0x20] = (int)(((lVar9 - lVar8) - lVar8) * 0x283a + 0x4000 >> 0xf);
    lVar8 = (lVar10 + lVar12) * 0x14d3;
    local_50[8] = (int)(lVar8 + (lVar10 + lVar11) * 0x38e4 + 0x4000 >> 0xf);
    local_50[0x18] = (int)(((lVar10 - lVar11) - lVar12) * 0x38e4 + 0x4000 >> 0xf);
    local_50[0x28] = (int)(lVar8 + (lVar12 - lVar11) * 0x38e4 + 0x4000 >> 0xf);
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_3x6 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2;
  INT32 tmp10, tmp11, tmp12;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We scale the results further by 2 as part of output adaption */
  /* scaling for different DCT size. */
  /* 3-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/6). */

  dataptr = data;
  for (ctr = 0; ctr < 6; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[2]);
    tmp1 = GETJSAMPLE(elemptr[1]);

    tmp2 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[2]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 - 3 * CENTERJSAMPLE) << (PASS1_BITS+1));
    dataptr[2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp1, FIX(0.707106781)), /* c2 */
	      CONST_BITS-PASS1_BITS-1);

    /* Odd part */

    dataptr[1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp2, FIX(1.224744871)),               /* c1 */
	      CONST_BITS-PASS1_BITS-1);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/6)*(8/3) = 32/9, which we partially
   * fold into the constant multipliers (other part was done in pass 1):
   * 6-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/12) * 16/9.
   */

  dataptr = data;
  for (ctr = 0; ctr < 3; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*5];
    tmp11 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*3];

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*3];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11, FIX(1.777777778)),         /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp12, FIX(2.177324216)),                 /* c2 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp11, FIX(1.257078722)), /* c4 */
	      CONST_BITS+PASS1_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp0 + tmp2, FIX(0.650711829));             /* c5 */

    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp0 + tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp2, FIX(1.777777778)),    /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp2 - tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}